

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O3

void runalltests_cpp_wrapper1(void)

{
  planck_unit_suite_t *ppVar1;
  
  ppVar1 = cpp_wrapper1_getsuite_1();
  planck_unit_run_suite(ppVar1);
  planck_unit_destroy_suite(ppVar1);
  ppVar1 = cpp_wrapper1_getsuite_2();
  planck_unit_run_suite(ppVar1);
  planck_unit_destroy_suite(ppVar1);
  return;
}

Assistant:

void
runalltests_cpp_wrapper1(
) {
	fdeleteall();

	planck_unit_suite_t *suite1 = cpp_wrapper1_getsuite_1();

	planck_unit_run_suite(suite1);
	planck_unit_destroy_suite(suite1);

	planck_unit_suite_t *suite2 = cpp_wrapper1_getsuite_2();

	planck_unit_run_suite(suite2);
	planck_unit_destroy_suite(suite2);
}